

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

bool __thiscall
Assimp::DefaultLogger::detatchStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  LogStreamInfo *this_00;
  bool bVar1;
  uint uVar2;
  reference ppLVar3;
  const_iterator local_40;
  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_38;
  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
  local_30;
  StreamIt it;
  bool res;
  uint severity_local;
  LogStream *pStream_local;
  DefaultLogger *this_local;
  
  if (pStream == (LogStream *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    it._M_current._4_4_ = severity;
    if (severity == 0) {
      it._M_current._4_4_ = 0xf;
    }
    it._M_current._3_1_ = 0;
    local_30._M_current =
         (LogStreamInfo **)
         std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::begin
                   (&this->m_StreamArray);
    while( true ) {
      local_38._M_current =
           (LogStreamInfo **)
           std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::end
                     (&this->m_StreamArray);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      ppLVar3 = __gnu_cxx::
                __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                ::operator*(&local_30);
      if ((*ppLVar3)->m_pStream == pStream) {
        uVar2 = it._M_current._4_4_ ^ 0xffffffff;
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                  ::operator*(&local_30);
        (*ppLVar3)->m_uiErrorSeverity = uVar2 & (*ppLVar3)->m_uiErrorSeverity;
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                  ::operator*(&local_30);
        if ((*ppLVar3)->m_uiErrorSeverity != 0) {
          return true;
        }
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                  ::operator*(&local_30);
        (*ppLVar3)->m_pStream = (LogStream *)0x0;
        ppLVar3 = __gnu_cxx::
                  __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
                  ::operator*(&local_30);
        this_00 = *ppLVar3;
        if (this_00 != (LogStreamInfo *)0x0) {
          LogStreamInfo::~LogStreamInfo(this_00);
          operator_delete(this_00);
        }
        __gnu_cxx::
        __normal_iterator<Assimp::LogStreamInfo*const*,std::vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>>>
        ::__normal_iterator<Assimp::LogStreamInfo**>
                  ((__normal_iterator<Assimp::LogStreamInfo*const*,std::vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>>>
                    *)&local_40,&local_30);
        std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::erase
                  (&this->m_StreamArray,local_40);
        it._M_current._3_1_ = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<Assimp::LogStreamInfo_**,_std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>_>
      ::operator++(&local_30);
    }
    this_local._7_1_ = (bool)(it._M_current._3_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool DefaultLogger::detatchStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = SeverityAll;
    }

    bool res( false );
    for ( StreamIt it = m_StreamArray.begin(); it != m_StreamArray.end(); ++it ) {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity &= ~severity;
            if ( (*it)->m_uiErrorSeverity == 0 ) {
                // don't delete the underlying stream 'cause the caller gains ownership again
                (**it).m_pStream = nullptr;
                delete *it;
                m_StreamArray.erase( it );
                res = true;
                break;
            }
            return true;
        }
    }
    return res;
}